

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,
                 CompatibleType t,char **param_6)

{
  pointer tgt_00;
  bool bVar1;
  bool bVar2;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *this;
  string *psVar3;
  cmLocalGenerator *localGenerator;
  reference ppcVar4;
  pointer genexInterpreter_00;
  ostream *poVar5;
  pair<bool,_const_char_*> pVar6;
  pointer local_838;
  byte local_7f3;
  byte local_7f2;
  string local_7e0;
  string local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  string local_780;
  undefined1 local_760 [8];
  ostringstream e_2;
  string local_5e8;
  byte local_5c8;
  pair<bool,_const_char_*> consistent_2;
  undefined1 local_598 [8];
  ostringstream e_1;
  string local_420;
  byte local_400;
  pair<bool,_const_char_*> consistent_1;
  undefined1 local_3d0 [8];
  ostringstream e;
  string local_258;
  byte local_238;
  pair<bool,_const_char_*> consistent;
  undefined1 local_208 [8];
  string reportEntry;
  char *ifacePropContent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  byte local_1b9;
  undefined1 local_1b8 [7];
  bool ifaceIsSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  cmGeneratorTarget *theTarget;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range1;
  string local_178;
  byte local_151;
  string local_150;
  undefined1 local_129;
  cmGeneratorExpressionInterpreter *local_128;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  local_120;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string interfaceProperty;
  allocator<char> local_d1;
  undefined1 local_d0 [8];
  string report;
  bool propInitialized;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *deps;
  iterator iStack_98;
  bool impliedByUse;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  byte local_61;
  undefined1 local_60 [7];
  bool explicitlySet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  char *propContent;
  char **param_5_local;
  CompatibleType t_local;
  char *defaultValue_local;
  string *config_local;
  string *p_local;
  cmGeneratorTarget *tgt_local;
  
  headPropKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)getTypedProperty<char_const*>(tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,tgt);
  local_78._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_60);
  local_70 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_78,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_80,p);
  iStack_98 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_60);
  local_61 = __gnu_cxx::operator!=(&local_70,&stack0xffffffffffffff68);
  bVar1 = cmGeneratorTarget::IsNullImpliedByLinkLibraries(tgt,p);
  local_7f2 = 1;
  if (bVar1 == (bool)(local_61 & 1)) {
    local_7f3 = 0;
    if (!bVar1) {
      local_7f3 = local_61 ^ 0xff;
    }
    local_7f2 = local_7f3;
  }
  if ((local_7f2 & 1) == 0) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                  ,0x1276,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  this = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  bVar2 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::empty
                    (this);
  if (bVar2) {
    tgt_local = (cmGeneratorTarget *)
                headPropKeys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    report.field_2._12_4_ = 1;
  }
  else {
    report.field_2._M_local_buf[0xb] = local_61 & 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d0," * Target \"",&local_d1);
    std::allocator<char>::~allocator(&local_d1);
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    std::__cxx11::string::operator+=((string *)local_d0,(string *)psVar3);
    if ((local_61 & 1) == 0) {
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)local_d0,"\" property is implied by use.\n");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_d0,"\" property not set.\n");
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)local_d0,"\" has property content \"");
      valueAsString<char_const*>
                ((string *)((long)&interfaceProperty.field_2 + 8),
                 (char *)headPropKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator+=
                ((string *)local_d0,(string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_d0,"\"\n");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &genexInterpreter,"INTERFACE_",p);
    bVar2 = std::operator==(p,"POSITION_INDEPENDENT_CODE");
    local_129 = 0;
    local_151 = 0;
    if (bVar2) {
      local_838 = (pointer)operator_new(0x68);
      local_129 = 1;
      local_128 = local_838;
      localGenerator = cmGeneratorTarget::GetLocalGenerator(tgt);
      std::__cxx11::string::string((string *)&local_150,(string *)config);
      local_151 = 1;
      std::__cxx11::string::string((string *)&local_178);
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                (local_838,localGenerator,&local_150,tgt,&local_178);
    }
    else {
      local_838 = (pointer)0x0;
    }
    local_129 = 0;
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,std::default_delete<cmGeneratorExpressionInterpreter>>
    ::unique_ptr<std::default_delete<cmGeneratorExpressionInterpreter>,void>
              ((unique_ptr<cmGeneratorExpressionInterpreter,std::default_delete<cmGeneratorExpressionInterpreter>>
                *)&local_120,local_838);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_178);
    }
    if ((local_151 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_150);
    }
    __end1 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
             begin(this);
    theTarget = (cmGeneratorTarget *)
                std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                end(this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                       *)&theTarget), bVar2) {
      ppcVar4 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&__end1);
      propKeys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar4;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b8,
                 (cmGeneratorTarget *)
                 propKeys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_1d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1b8);
      local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8);
      local_1c8 = std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                            (local_1d0,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_1d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &genexInterpreter);
      ifacePropContent =
           (char *)std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1b8);
      local_1b9 = __gnu_cxx::operator!=
                            (&local_1c8,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&ifacePropContent);
      tgt_00 = propKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      genexInterpreter_00 =
           std::
           unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
           ::get(&local_120);
      reportEntry.field_2._8_8_ =
           getTypedProperty<char_const*>
                     ((cmGeneratorTarget *)tgt_00,(string *)&genexInterpreter,genexInterpreter_00);
      std::__cxx11::string::string((string *)local_208);
      if ((local_1b9 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)local_208," * Target \"");
        psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((cmGeneratorTarget *)
                            propKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)local_208,(string *)psVar3);
        std::__cxx11::string::operator+=((string *)local_208,"\" property value \"");
        valueAsString<char_const*>((string *)&consistent.second,(char *)reportEntry.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)local_208,(string *)&consistent.second);
        std::__cxx11::string::~string((string *)&consistent.second);
        std::__cxx11::string::operator+=((string *)local_208,"\" ");
      }
      if ((local_61 & 1) == 0) {
        if (bVar1) {
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)impliedValue<char_const*>
                                  ((char *)headPropKeys.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((local_1b9 & 1) == 0) {
            report.field_2._12_4_ = 3;
          }
          else {
            pVar6 = consistentProperty<char_const*>
                              ((char *)headPropKeys.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (char *)reportEntry.field_2._8_8_,t);
            consistent_1._0_8_ = pVar6.second;
            local_400 = pVar6.first;
            std::__cxx11::string::operator+=((string *)local_d0,(string *)local_208);
            compatibilityAgree_abi_cxx11_
                      (&local_420,t,
                       headPropKeys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                       (pointer)consistent_1._0_8_);
            std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_420);
            std::__cxx11::string::~string((string *)&local_420);
            if ((local_400 & 1) == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
              poVar5 = std::operator<<((ostream *)local_598,"Property ");
              poVar5 = std::operator<<(poVar5,(string *)p);
              poVar5 = std::operator<<(poVar5," on target \"");
              psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
              poVar5 = std::operator<<(poVar5,(string *)psVar3);
              poVar5 = std::operator<<(poVar5,"\" is\nimplied to be ");
              poVar5 = std::operator<<(poVar5,defaultValue);
              poVar5 = std::operator<<(poVar5,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar5 = std::operator<<(poVar5,(string *)p);
              poVar5 = std::operator<<(poVar5," property on\ndependency \"");
              psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                                 ((cmGeneratorTarget *)
                                  propKeys.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              poVar5 = std::operator<<(poVar5,(string *)psVar3);
              std::operator<<(poVar5,"\" is in conflict.\n");
              std::__cxx11::ostringstream::str();
              cmSystemTools::Error((string *)&consistent_2.second);
              std::__cxx11::string::~string((string *)&consistent_2.second);
              report.field_2._12_4_ = 2;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
            }
            else {
              headPropKeys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)consistent_1._0_8_;
              report.field_2._12_4_ = 3;
            }
          }
        }
        else if ((local_1b9 & 1) == 0) {
          report.field_2._12_4_ = 3;
        }
        else if ((report.field_2._M_local_buf[0xb] & 1U) == 0) {
          std::operator+(&local_7a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208,"(Interface set)\n");
          std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_7a0);
          std::__cxx11::string::~string((string *)&local_7a0);
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)reportEntry.field_2._8_8_;
          report.field_2._M_local_buf[0xb] = '\x01';
          report.field_2._12_4_ = 0;
        }
        else {
          pVar6 = consistentProperty<char_const*>
                            ((char *)headPropKeys.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (char *)reportEntry.field_2._8_8_,t);
          consistent_2._0_8_ = pVar6.second;
          local_5c8 = pVar6.first;
          std::__cxx11::string::operator+=((string *)local_d0,(string *)local_208);
          compatibilityAgree_abi_cxx11_
                    (&local_5e8,t,
                     headPropKeys.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                     (pointer)consistent_2._0_8_);
          std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_5e8);
          std::__cxx11::string::~string((string *)&local_5e8);
          if ((local_5c8 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
            poVar5 = std::operator<<((ostream *)local_760,"The INTERFACE_");
            poVar5 = std::operator<<(poVar5,(string *)p);
            poVar5 = std::operator<<(poVar5," property of \"");
            psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((cmGeneratorTarget *)
                                propKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar5 = std::operator<<(poVar5,(string *)psVar3);
            poVar5 = std::operator<<(poVar5,"\" does\nnot agree with the value of ");
            poVar5 = std::operator<<(poVar5,(string *)p);
            poVar5 = std::operator<<(poVar5," already determined\nfor \"");
            psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar5 = std::operator<<(poVar5,(string *)psVar3);
            std::operator<<(poVar5,"\".\n");
            std::__cxx11::ostringstream::str();
            cmSystemTools::Error(&local_780);
            std::__cxx11::string::~string((string *)&local_780);
            report.field_2._12_4_ = 2;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
          }
          else {
            headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)consistent_2._0_8_;
            report.field_2._12_4_ = 3;
          }
        }
      }
      else if ((local_1b9 & 1) == 0) {
        report.field_2._12_4_ = 3;
      }
      else {
        pVar6 = consistentProperty<char_const*>
                          ((char *)headPropKeys.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (char *)reportEntry.field_2._8_8_,t);
        consistent._0_8_ = pVar6.second;
        local_238 = pVar6.first;
        std::__cxx11::string::operator+=((string *)local_d0,(string *)local_208);
        compatibilityAgree_abi_cxx11_
                  (&local_258,t,
                   headPropKeys.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)consistent._0_8_);
        std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        if ((local_238 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
          poVar5 = std::operator<<((ostream *)local_3d0,"Property ");
          poVar5 = std::operator<<(poVar5,(string *)p);
          poVar5 = std::operator<<(poVar5," on target \"");
          psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
          poVar5 = std::operator<<(poVar5,(string *)psVar3);
          poVar5 = std::operator<<(poVar5,"\" does\nnot match the INTERFACE_");
          poVar5 = std::operator<<(poVar5,(string *)p);
          poVar5 = std::operator<<(poVar5," property requirement\nof dependency \"");
          psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                             ((cmGeneratorTarget *)
                              propKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar5 = std::operator<<(poVar5,(string *)psVar3);
          std::operator<<(poVar5,"\".\n");
          std::__cxx11::ostringstream::str();
          cmSystemTools::Error((string *)&consistent_1.second);
          std::__cxx11::string::~string((string *)&consistent_1.second);
          report.field_2._12_4_ = 2;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
        }
        else {
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)consistent._0_8_;
          report.field_2._12_4_ = 3;
        }
      }
      std::__cxx11::string::~string((string *)local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8);
      if ((report.field_2._12_4_ != 0) && (report.field_2._12_4_ == 2)) break;
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
      ::operator++(&__end1);
    }
    valueAsString<char_const*>
              (&local_7c0,
               (char *)headPropKeys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    compatibilityType_abi_cxx11_(&local_7e0,t);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,&local_7c0,(string *)local_d0,&local_7e0);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::__cxx11::string::~string((string *)&local_7c0);
    tgt_local = (cmGeneratorTarget *)
                headPropKeys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    report.field_2._12_4_ = 1;
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    ::~unique_ptr(&local_120);
    std::__cxx11::string::~string((string *)&genexInterpreter);
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  return (char *)tgt_local;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}